

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O2

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>>::X<Fad<double>>
          (TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>> *this,
          TPZFMatrix<double> *cornerco,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *result)

{
  int i;
  long lVar1;
  long lVar2;
  int i_1;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  local_250;
  Fad<double> NormValue;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  local_220;
  Fad<double> local_208;
  TPZManVector<Fad<double>,_3> Xsphere;
  TPZManVector<double,_3> Xc;
  TPZManVector<Fad<double>,_3> XtminusXc;
  TPZManVector<Fad<double>,_3> xqsi;
  
  XtminusXc.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  XtminusXc.super_TPZVec<Fad<double>_>.fStore._0_4_ = 0;
  XtminusXc.super_TPZVec<Fad<double>_>.fNElements = 0;
  XtminusXc.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&xqsi,3,(Fad<double> *)&XtminusXc);
  Fad<double>::~Fad((Fad<double> *)&XtminusXc);
  Xsphere.super_TPZVec<Fad<double>_>._vptr_TPZVec = (_func_int **)0x0;
  Xsphere.super_TPZVec<Fad<double>_>.fStore =
       (Fad<double> *)((ulong)Xsphere.super_TPZVec<Fad<double>_>.fStore._4_4_ << 0x20);
  Xsphere.super_TPZVec<Fad<double>_>.fNElements = 0;
  Xsphere.super_TPZVec<Fad<double>_>.fNAlloc = 0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&XtminusXc,3,(Fad<double> *)&Xsphere);
  Fad<double>::~Fad((Fad<double> *)&Xsphere);
  TPZGeoBlend<pzgeom::TPZGeoTriangle>::X<Fad<double>>
            ((TPZGeoBlend<pzgeom::TPZGeoTriangle> *)this,cornerco,loc,
             &xqsi.super_TPZVec<Fad<double>_>);
  TPZManVector<double,_3>::TPZManVector(&Xc,(TPZVec<double> *)(this + 0x8c0));
  NormValue.val_ = 0.0;
  NormValue.dx_.num_elts = 0;
  NormValue.dx_.ptr_to_data = (double *)0x0;
  NormValue.defaultVal = 0.0;
  lVar2 = 0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    Xsphere.super_TPZVec<Fad<double>_>._vptr_TPZVec =
         (_func_int **)((long)&(xqsi.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar2);
    Xsphere.super_TPZVec<Fad<double>_>.fStore = (Fad<double> *)Xc.super_TPZVec<double>.fStore[lVar1]
    ;
    Xsphere.super_TPZVec<Fad<double>_>.fNElements = 0;
    Fad<double>::operator=
              ((Fad<double> *)
               (CONCAT44(XtminusXc.super_TPZVec<Fad<double>_>.fStore._4_4_,
                         XtminusXc.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar2),
               (FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)&Xsphere);
    Xsphere.super_TPZVec<Fad<double>_>._vptr_TPZVec =
         (_func_int **)
         (CONCAT44(XtminusXc.super_TPZVec<Fad<double>_>.fStore._4_4_,
                   XtminusXc.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar2);
    Xsphere.super_TPZVec<Fad<double>_>.fStore =
         (Fad<double> *)Xsphere.super_TPZVec<Fad<double>_>._vptr_TPZVec;
    Fad<double>::operator+=
              (&NormValue,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&Xsphere);
    lVar2 = lVar2 + 0x20;
  }
  sqrt<double>((FadExpr<FadFuncSqrt<Fad<double>_>_> *)&Xsphere,&NormValue);
  Fad<double>::operator=(&NormValue,(FadExpr<FadFuncSqrt<Fad<double>_>_> *)&Xsphere);
  Fad<double>::~Fad((Fad<double> *)&Xsphere.super_TPZVec<Fad<double>_>.fStore);
  local_208.val_ = 0.0;
  local_208.dx_._0_8_ = (ulong)(uint)local_208.dx_._4_4_ << 0x20;
  local_208.dx_.ptr_to_data = (double *)0x0;
  local_208.defaultVal = 0.0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&Xsphere,3,&local_208);
  Fad<double>::~Fad(&local_208);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    local_208.dx_._0_8_ = *(undefined8 *)(this + 0x8e0);
    local_208.dx_.ptr_to_data = (double *)0x0;
    local_208.defaultVal = (double)&NormValue;
    local_250.fadexpr_.right_ =
         (Fad<double> *)
         (CONCAT44(XtminusXc.super_TPZVec<Fad<double>_>.fStore._4_4_,
                   XtminusXc.super_TPZVec<Fad<double>_>.fStore._0_4_) + lVar1);
    local_220.fadexpr_.right_.constant_ = Xc.super_TPZVec<double>.fStore[lVar2];
    local_220.fadexpr_.right_.defaultVal = 0.0;
    local_250.fadexpr_.left_ = (FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)&local_208;
    local_220.fadexpr_.left_ = &local_250;
    Fad<double>::operator=((Fad<double> *)((long)&result->fStore->val_ + lVar1),&local_220);
    lVar1 = lVar1 + 0x20;
  }
  TPZManVector<Fad<double>,_3>::~TPZManVector(&Xsphere);
  Fad<double>::~Fad(&NormValue);
  TPZManVector<double,_3>::~TPZManVector(&Xc);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&XtminusXc);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&xqsi);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &cornerco,TPZVec<T> &loc,TPZVec<T> &result) const
        {
//            TPZFNMatrix<3*NNodes> coord(3,NNodes);
//            CornerCoordinates(gel, coord);
//            X(coord,loc,result);
            
            
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> XtminusXc(3,0.0); // will store (x,y,z)-xc
            GeomTriang::X(cornerco,loc,xqsi);
            TPZManVector<REAL,3> Xc = fXc;
            
            T NormValue = 0.0;
            
            for (int i = 0; i < 3; i++) {
                XtminusXc[i] = xqsi[i] - Xc[i];
                NormValue += XtminusXc[i]*XtminusXc[i];
            }
            
//            XtminusXc[0,0)= xqsi[0] - Xc[0];
//            XtminusXc(1,0)= xqsi[1] - Xc[1];
//            XtminusXc(2,0)= xqsi[2] - Xc[2];
            
            NormValue = sqrt(NormValue);
            
            TPZManVector<T,3> Xsphere(3,0.0);
            for(int i=0; i<3; i++)
            {
                result[i] = (fR/NormValue)*(XtminusXc[i])+ Xc[i];
            }
//            Xsphere[0] = (fR/NormValue)*(XtminusXc(0,0)+Xc[0]);
//            Xsphere[1] = (fR/NormValue)*(XtminusXc(1,0)+Xc[1]);
//            Xsphere[2] = (fR/NormValue)*(XtminusXc(2,0)+Xc[2]);		
//            result=Xsphere;
            
            
        }